

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

void __thiscall re2::Prog::Optimize(Prog *this)

{
  Inst *this_00;
  Inst *pIVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  uint uVar7;
  Inst *ip;
  Workq q;
  SparseSet local_48;
  
  SparseSet::SparseSet(&local_48,this->size_);
  local_48.size_ = 0;
  AddToQueue(&local_48,this->start_);
  puVar6 = (uint *)local_48.dense_;
  do {
    if (puVar6 == (uint *)(local_48.dense_ + local_48.size_)) {
      local_48.size_ = 0;
      AddToQueue(&local_48,this->start_);
      for (puVar6 = (uint *)local_48.dense_; puVar6 != (uint *)(local_48.dense_ + local_48.size_);
          puVar6 = puVar6 + 1) {
        uVar3 = *puVar6;
        pIVar1 = this->inst_;
        AddToQueue(&local_48,pIVar1[(int)uVar3].out_opcode_ >> 4);
        pIVar1 = pIVar1 + (int)uVar3;
        uVar5 = pIVar1->out_opcode_;
        if ((uVar5 & 7) == 0) {
          iVar4 = Inst::out1(pIVar1);
          AddToQueue(&local_48,iVar4);
          uVar5 = pIVar1->out_opcode_;
        }
        if ((uVar5 & 7) == 0) {
          this_00 = this->inst_ + (uVar5 >> 4);
          iVar4 = Inst::out1(pIVar1);
          ip = this->inst_ + iVar4;
          if ((((((this_00->out_opcode_ & 7) == 2) && (this_00->out_opcode_ >> 4 == uVar3)) &&
               (iVar4 = Inst::lo(this_00), iVar4 == 0)) &&
              ((iVar4 = Inst::hi(this_00), iVar4 == 0xff && (bVar2 = IsMatch(this,ip), bVar2)))) ||
             ((((bVar2 = IsMatch(this,this_00), bVar2 &&
                (((ip->out_opcode_ & 7) == 2 && (ip->out_opcode_ >> 4 == uVar3)))) &&
               (iVar4 = Inst::lo(ip), iVar4 == 0)) && (iVar4 = Inst::hi(ip), iVar4 == 0xff)))) {
            pIVar1->out_opcode_ = (pIVar1->out_opcode_ & 0xfffffff8) + 1;
          }
        }
      }
      SparseSet::~SparseSet(&local_48);
      return;
    }
    pIVar1 = this->inst_ + (int)*puVar6;
    uVar3 = pIVar1->out_opcode_;
    do {
      uVar5 = uVar3;
      if (uVar5 < 0x10) {
        uVar7 = 0;
        break;
      }
      uVar7 = uVar5 >> 4;
      uVar3 = this->inst_[uVar7].out_opcode_;
    } while ((uVar3 & 7) == 6);
    pIVar1->out_opcode_ = pIVar1->out_opcode_ & 0xf | uVar5 & 0xfffffff0;
    AddToQueue(&local_48,uVar7);
    if ((pIVar1->out_opcode_ & 7) == 0) {
      uVar3 = Inst::out1(pIVar1);
      do {
        uVar5 = uVar3;
        if (uVar5 == 0) break;
        uVar7 = this->inst_[(int)uVar5].out_opcode_;
        uVar3 = uVar7 >> 4;
      } while ((uVar7 & 7) == 6);
      (pIVar1->field_1).cap_ = uVar5;
      iVar4 = Inst::out1(pIVar1);
      AddToQueue(&local_48,iVar4);
    }
    puVar6 = puVar6 + 1;
  } while( true );
}

Assistant:

void Prog::Optimize() {
  Workq q(size_);

  // Eliminate nops.  Most are taken out during compilation
  // but a few are hard to avoid.
  q.clear();
  AddToQueue(&q, start_);
  for (Workq::iterator i = q.begin(); i != q.end(); ++i) {
    int id = *i;

    Inst* ip = inst(id);
    int j = ip->out();
    Inst* jp;
    while (j != 0 && (jp=inst(j))->opcode() == kInstNop) {
      j = jp->out();
    }
    ip->set_out(j);
    AddToQueue(&q, ip->out());

    if (ip->opcode() == kInstAlt) {
      j = ip->out1();
      while (j != 0 && (jp=inst(j))->opcode() == kInstNop) {
        j = jp->out();
      }
      ip->out1_ = j;
      AddToQueue(&q, ip->out1());
    }
  }

  // Insert kInstAltMatch instructions
  // Look for
  //   ip: Alt -> j | k
  //	  j: ByteRange [00-FF] -> ip
  //    k: Match
  // or the reverse (the above is the greedy one).
  // Rewrite Alt to AltMatch.
  q.clear();
  AddToQueue(&q, start_);
  for (Workq::iterator i = q.begin(); i != q.end(); ++i) {
    int id = *i;
    Inst* ip = inst(id);
    AddToQueue(&q, ip->out());
    if (ip->opcode() == kInstAlt)
      AddToQueue(&q, ip->out1());

    if (ip->opcode() == kInstAlt) {
      Inst* j = inst(ip->out());
      Inst* k = inst(ip->out1());
      if (j->opcode() == kInstByteRange && j->out() == id &&
          j->lo() == 0x00 && j->hi() == 0xFF &&
          IsMatch(this, k)) {
        ip->set_opcode(kInstAltMatch);
        continue;
      }
      if (IsMatch(this, j) &&
          k->opcode() == kInstByteRange && k->out() == id &&
          k->lo() == 0x00 && k->hi() == 0xFF) {
        ip->set_opcode(kInstAltMatch);
      }
    }
  }
}